

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall HEkk::clearBadBasisChange(HEkk *this,BadBasisChangeReason reason)

{
  const_iterator __first;
  __normal_iterator<const_HighsSimplexBadBasisChangeRecord_*,_std::vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>_>
  *this_00;
  iterator this_01;
  int in_ESI;
  long in_RDI;
  vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
  *in_stack_ffffffffffffff98;
  anon_class_4_1_69698382_for__M_pred __pred;
  __normal_iterator<HighsSimplexBadBasisChangeRecord_*,_std::vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>_>
  in_stack_ffffffffffffffb0;
  __normal_iterator<HighsSimplexBadBasisChangeRecord_*,_std::vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>_>
  in_stack_ffffffffffffffb8;
  const_iterator in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  
  if (in_ESI == 0) {
    std::vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
    ::clear((vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
             *)0x767e7f);
  }
  else {
    this_00 = (__normal_iterator<const_HighsSimplexBadBasisChangeRecord_*,_std::vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>_>
               *)(in_RDI + 0x3880);
    std::vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
    ::begin(in_stack_ffffffffffffff98);
    __pred.reason = (BadBasisChangeReason)((ulong)in_RDI >> 0x20);
    std::vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
    ::end(in_stack_ffffffffffffff98);
    std::
    remove_if<__gnu_cxx::__normal_iterator<HighsSimplexBadBasisChangeRecord*,std::vector<HighsSimplexBadBasisChangeRecord,std::allocator<HighsSimplexBadBasisChangeRecord>>>,HEkk::clearBadBasisChange(BadBasisChangeReason)::__0>
              (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,__pred);
    __gnu_cxx::
    __normal_iterator<HighsSimplexBadBasisChangeRecord_const*,std::vector<HighsSimplexBadBasisChangeRecord,std::allocator<HighsSimplexBadBasisChangeRecord>>>
    ::__normal_iterator<HighsSimplexBadBasisChangeRecord*>
              (this_00,(__normal_iterator<HighsSimplexBadBasisChangeRecord_*,_std::vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>_>
                        *)in_stack_ffffffffffffff98);
    this_01 = std::
              vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
              ::end(in_stack_ffffffffffffff98);
    __gnu_cxx::
    __normal_iterator<HighsSimplexBadBasisChangeRecord_const*,std::vector<HighsSimplexBadBasisChangeRecord,std::allocator<HighsSimplexBadBasisChangeRecord>>>
    ::__normal_iterator<HighsSimplexBadBasisChangeRecord*>
              (this_00,(__normal_iterator<HighsSimplexBadBasisChangeRecord_*,_std::vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>_>
                        *)in_stack_ffffffffffffff98);
    __first._M_current._4_4_ = in_ESI;
    __first._M_current._0_4_ = in_stack_ffffffffffffffc8;
    std::vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
    ::erase((vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
             *)this_01._M_current,__first,in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

void HEkk::clearBadBasisChange(const BadBasisChangeReason reason) {
  if (reason == BadBasisChangeReason::kAll) {
    bad_basis_change_.clear();
  } else {
    bad_basis_change_.erase(
        std::remove_if(
            bad_basis_change_.begin(), bad_basis_change_.end(),
            [reason](const HighsSimplexBadBasisChangeRecord& record) {
              return record.reason == reason;
            }),
        bad_basis_change_.end());
  }
}